

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

void __thiscall embree::SubdivMesh::SubdivMesh(SubdivMesh *this,Device *device)

{
  size_t *psVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  size_t sVar6;
  Topology *pTVar7;
  Device *pDVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  HoleSet *pHVar14;
  VertexCreaseMap *pVVar15;
  EdgeCreaseMap *pEVar16;
  long lVar17;
  BufferView<embree::Vec3fa> *pBVar18;
  Topology *pTVar19;
  long lVar20;
  ulong uVar21;
  pointer *__ptr;
  size_type __n;
  pointer *__ptr_2;
  MemoryMonitorInterface *pMVar22;
  ulong uVar23;
  ulong uVar24;
  Topology local_d0;
  
  Geometry::Geometry(&this->super_Geometry,device,GTY_SUBDIV_MESH,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMesh_0220e3b8;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  (this->faceVertices).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->faceVertices).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->faceVertices).super_RawBufferView.stride = 0;
  *(undefined8 *)((long)&(this->faceVertices).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->faceVertices).super_RawBufferView.num + 4) = 0;
  (this->faceVertices).super_RawBufferView.modCounter = 1;
  (this->faceVertices).super_RawBufferView.modified = true;
  (this->faceVertices).super_RawBufferView.userData = 0;
  (this->faceVertices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  psVar1 = &(this->topology).size_active;
  psVar2 = &(this->vertices).size_active;
  (this->topology).size_active = 0;
  (this->topology).size_alloced = 0;
  (this->topology).items = (Topology *)0x0;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  (this->edge_creases).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->edge_creases).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->edge_creases).super_RawBufferView.stride = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.num + 4) = 0;
  (this->edge_creases).super_RawBufferView.modCounter = 1;
  (this->edge_creases).super_RawBufferView.modified = true;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.num + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)&(this->edge_creases).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.buffer.ptr + 4) = 0;
  (this->edge_crease_weights).super_RawBufferView.modCounter = 1;
  (this->edge_crease_weights).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->edge_crease_weights).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.num + 4) = 0;
  (this->vertex_creases).super_RawBufferView.modCounter = 1;
  (this->vertex_creases).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->vertex_creases).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.num + 4) = 0;
  (this->vertex_crease_weights).super_RawBufferView.modCounter = 1;
  (this->vertex_crease_weights).super_RawBufferView.modified = true;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.num + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)&(this->vertex_crease_weights).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.buffer.ptr + 4) = 0;
  (this->levels).super_RawBufferView.modCounter = 1;
  (this->levels).super_RawBufferView.modified = true;
  (this->levels).super_RawBufferView.userData = 0;
  (this->levels).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  this->tessellationRate = 2.0;
  (this->holes).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->holes).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->holes).super_RawBufferView.stride = 0;
  (this->holes).super_RawBufferView.num = 0;
  (this->holes).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
  (this->holes).super_RawBufferView.modCounter = 1;
  (this->holes).super_RawBufferView.modified = true;
  pMVar22 = &device->super_MemoryMonitorInterface;
  if (device == (Device *)0x0) {
    pMVar22 = (MemoryMonitorInterface *)0x0;
  }
  *(undefined8 *)&(this->holes).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->holes).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined4 *)((long)&this->numHalfEdges + 4) = 0;
  (this->faceStartEdge).alloc.device = pMVar22;
  (this->faceStartEdge).alloc.hugepages = false;
  (this->faceStartEdge).size_active = 0;
  (this->faceStartEdge).size_alloced = 0;
  (this->faceStartEdge).items = (uint *)0x0;
  (this->halfEdgeFace).alloc.device = pMVar22;
  (this->halfEdgeFace).alloc.hugepages = false;
  (this->halfEdgeFace).items = (uint *)0x0;
  (this->halfEdgeFace).size_active = 0;
  (this->halfEdgeFace).size_alloced = 0;
  pHVar14 = (HoleSet *)operator_new(0x18);
  *(undefined8 *)&(pHVar14->holeSet).vec = 0;
  (pHVar14->holeSet).vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pHVar14->holeSet).vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->holeSet)._M_t.super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>
  ._M_t.super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
  super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl = pHVar14;
  (this->invalid_face).alloc.device = pMVar22;
  (this->invalid_face).alloc.hugepages = false;
  (this->invalid_face).size_active = 0;
  (this->invalid_face).size_alloced = 0;
  (this->invalid_face).items = (char *)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar15 = (VertexCreaseMap *)operator_new(0x18);
  *(undefined8 *)&(pVVar15->vertexCreaseMap).vec = 0;
  (pVVar15->vertexCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_int,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_int,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pVVar15->vertexCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_int,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_int,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertexCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>._M_t
  .super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>.
  super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl = pVVar15;
  pEVar16 = (EdgeCreaseMap *)operator_new(0x18);
  *(undefined8 *)&(pEVar16->edgeCreaseMap).vec = 0;
  (pEVar16->edgeCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_long,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_long,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar16->edgeCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_long,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_long,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgeCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>._M_t.
  super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>.
  super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl = pEVar16;
  this->commitCounter = 0;
  uVar23 = (ulong)(this->super_Geometry).numTimeSteps;
  if ((this->vertices).size_alloced == uVar23) {
    uVar24 = *psVar2;
    lVar17 = uVar23 - uVar24;
    if (uVar24 <= uVar23 && lVar17 != 0) {
      lVar20 = uVar24 * 0x38 + 0x30;
      do {
        pBVar5 = (this->vertices).items;
        puVar3 = (undefined8 *)((long)pBVar5 + lVar20 + -0x20);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)pBVar5 + lVar20 + -0x30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined8 *)((long)pBVar5 + lVar20 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar5 + lVar20 + -8) = 1;
        *(undefined4 *)((long)pBVar5 + lVar20 + -4) = 0;
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar20) = 0;
        lVar20 = lVar20 + 0x38;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    *psVar2 = uVar23;
  }
  else {
    pBVar5 = (this->vertices).items;
    pBVar18 = __gnu_cxx::new_allocator<embree::BufferView<embree::Vec3fa>_>::allocate
                        ((new_allocator<embree::BufferView<embree::Vec3fa>_> *)&this->vertices,
                         uVar23,(void *)0x0);
    (this->vertices).items = pBVar18;
    uVar24 = (this->vertices).size_active;
    if (uVar24 != 0) {
      lVar17 = 0x30;
      uVar21 = 0;
      do {
        pBVar18 = (this->vertices).items;
        puVar3 = (undefined8 *)((long)pBVar5 + lVar17 + -0x30);
        uVar9 = *puVar3;
        uVar10 = puVar3[1];
        puVar3 = (undefined8 *)((long)pBVar5 + lVar17 + -0x20);
        uVar11 = *puVar3;
        uVar12 = puVar3[1];
        puVar3 = (undefined8 *)((long)pBVar5 + lVar17 + -0x10);
        uVar13 = puVar3[1];
        puVar4 = (undefined8 *)((long)pBVar18 + lVar17 + -0x10);
        *puVar4 = *puVar3;
        puVar4[1] = uVar13;
        puVar3 = (undefined8 *)((long)pBVar18 + lVar17 + -0x20);
        *puVar3 = uVar11;
        puVar3[1] = uVar12;
        puVar3 = (undefined8 *)((long)pBVar18 + lVar17 + -0x30);
        *puVar3 = uVar9;
        puVar3[1] = uVar10;
        *(undefined8 *)((long)&(pBVar18->super_RawBufferView).ptr_ofs + lVar17) =
             *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar17);
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar17) = 0;
        uVar21 = uVar21 + 1;
        uVar24 = (this->vertices).size_active;
        lVar17 = lVar17 + 0x38;
      } while (uVar21 < uVar24);
    }
    lVar17 = uVar23 - uVar24;
    if (uVar24 <= uVar23 && lVar17 != 0) {
      lVar20 = uVar24 * 0x38 + 0x30;
      do {
        pBVar18 = (this->vertices).items;
        puVar3 = (undefined8 *)((long)pBVar18 + lVar20 + -0x20);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)pBVar18 + lVar20 + -0x30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined8 *)((long)pBVar18 + lVar20 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar18 + lVar20 + -8) = 1;
        *(undefined4 *)((long)pBVar18 + lVar20 + -4) = 0;
        *(undefined8 *)((long)&(pBVar18->super_RawBufferView).ptr_ofs + lVar20) = 0;
        lVar20 = lVar20 + 0x38;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    operator_delete(pBVar5);
    (this->vertices).size_active = uVar23;
    (this->vertices).size_alloced = uVar23;
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::resize(&this->vertex_buffer_tags,(ulong)(this->super_Geometry).numTimeSteps);
  sVar6 = (this->topology).size_alloced;
  __n = sVar6 + (sVar6 == 0);
  if (1 < (this->topology).size_active) {
    if (1 < *psVar1) {
      uVar23 = 1;
      lVar17 = 0xa0;
      do {
        Topology::~Topology((Topology *)((long)&((this->topology).items)->mesh + lVar17));
        uVar23 = uVar23 + 1;
        lVar17 = lVar17 + 0xa0;
      } while (uVar23 < (this->topology).size_active);
    }
    *psVar1 = 1;
  }
  if ((this->topology).size_alloced == __n) {
    if (*psVar1 == 0) {
      pTVar7 = (this->topology).items;
      (pTVar7->vertexIndices).super_RawBufferView.stride = 0;
      (pTVar7->vertexIndices).super_RawBufferView.num = 0;
      (pTVar7->vertexIndices).super_RawBufferView.ptr_ofs = (char *)0x0;
      (pTVar7->vertexIndices).super_RawBufferView.dptr_ofs = (char *)0x0;
      (pTVar7->vertexIndices).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
      (pTVar7->vertexIndices).super_RawBufferView.modCounter = 1;
      (pTVar7->vertexIndices).super_RawBufferView.modified = true;
      (pTVar7->vertexIndices).super_RawBufferView.userData = 0;
      (pTVar7->vertexIndices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
      (pTVar7->halfEdges).alloc.device = (MemoryMonitorInterface *)0x0;
      (pTVar7->halfEdges).alloc.hugepages = false;
      (pTVar7->halfEdges).size_active = 0;
      (pTVar7->halfEdges).size_alloced = 0;
      (pTVar7->halfEdges).items = (HalfEdge *)0x0;
      (pTVar7->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar7->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar7->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar7->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar7->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar7->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    *psVar1 = 1;
  }
  else {
    pTVar7 = (this->topology).items;
    pTVar19 = __gnu_cxx::new_allocator<embree::SubdivMesh::Topology>::allocate
                        ((new_allocator<embree::SubdivMesh::Topology> *)&this->topology,__n,
                         (void *)0x0);
    (this->topology).items = pTVar19;
    uVar23 = (this->topology).size_active;
    if (uVar23 != 0) {
      lVar17 = 0;
      uVar24 = 0;
      do {
        pTVar19 = (Topology *)((long)&pTVar7->mesh + lVar17);
        Topology::Topology((Topology *)((long)&((this->topology).items)->mesh + lVar17),pTVar19);
        Topology::~Topology(pTVar19);
        uVar24 = uVar24 + 1;
        uVar23 = *psVar1;
        lVar17 = lVar17 + 0xa0;
      } while (uVar24 < uVar23);
    }
    if (uVar23 == 0) {
      pTVar19 = (this->topology).items;
      (pTVar19->vertexIndices).super_RawBufferView.stride = 0;
      (pTVar19->vertexIndices).super_RawBufferView.num = 0;
      (pTVar19->vertexIndices).super_RawBufferView.ptr_ofs = (char *)0x0;
      (pTVar19->vertexIndices).super_RawBufferView.dptr_ofs = (char *)0x0;
      (pTVar19->vertexIndices).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
      (pTVar19->vertexIndices).super_RawBufferView.modCounter = 1;
      (pTVar19->vertexIndices).super_RawBufferView.modified = true;
      (pTVar19->vertexIndices).super_RawBufferView.userData = 0;
      (pTVar19->vertexIndices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
      (pTVar19->halfEdges).alloc.device = (MemoryMonitorInterface *)0x0;
      (pTVar19->halfEdges).alloc.hugepages = false;
      (pTVar19->halfEdges).size_active = 0;
      (pTVar19->halfEdges).size_alloced = 0;
      (pTVar19->halfEdges).items = (HalfEdge *)0x0;
      (pTVar19->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar19->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar19->halfEdges0).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar19->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar19->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar19->halfEdges1).
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    operator_delete(pTVar7);
    (this->topology).size_active = 1;
    (this->topology).size_alloced = __n;
  }
  local_d0.vertexIndices.super_RawBufferView.ptr_ofs = (char *)0x0;
  local_d0.vertexIndices.super_RawBufferView.dptr_ofs = (char *)0x0;
  local_d0.vertexIndices.super_RawBufferView.stride = 0;
  local_d0.vertexIndices.super_RawBufferView.num = 0;
  local_d0.vertexIndices.super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
  local_d0.vertexIndices.super_RawBufferView.modCounter = 1;
  local_d0.vertexIndices.super_RawBufferView.modified = true;
  local_d0.vertexIndices.super_RawBufferView.userData = 0;
  local_d0.vertexIndices.super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  local_d0.subdiv_mode = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
  pDVar8 = (this->super_Geometry).device;
  local_d0.halfEdges.alloc.device = &pDVar8->super_MemoryMonitorInterface;
  if (pDVar8 == (Device *)0x0) {
    local_d0.halfEdges.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_d0.halfEdges.alloc.hugepages = false;
  local_d0.halfEdges.size_active = 0;
  local_d0.halfEdges.size_alloced = 0;
  local_d0.halfEdges.items = (HalfEdge *)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.mesh = this;
  Topology::operator=((this->topology).items,&local_d0);
  if (local_d0.halfEdges1.
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.halfEdges1.
                    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.halfEdges0.
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.halfEdges0.
                    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar6 = local_d0.halfEdges.size_alloced;
  if (local_d0.halfEdges.items != (HalfEdge *)0x0) {
    if (local_d0.halfEdges.size_alloced << 5 < 0x1c00000) {
      alignedFree(local_d0.halfEdges.items);
    }
    else {
      os_free(local_d0.halfEdges.items,local_d0.halfEdges.size_alloced << 5,
              local_d0.halfEdges.alloc.hugepages);
    }
  }
  if (sVar6 != 0) {
    (**(local_d0.halfEdges.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_d0.halfEdges.alloc.device,sVar6 * -0x20,1);
  }
  local_d0.halfEdges.size_active = 0;
  local_d0.halfEdges.size_alloced = 0;
  local_d0.halfEdges.items = (HalfEdge *)0x0;
  if (local_d0.vertexIndices.super_RawBufferView.buffer.ptr != (Buffer *)0x0) {
    (*((local_d0.vertexIndices.super_RawBufferView.buffer.ptr)->super_RefCount)._vptr_RefCount[3])()
    ;
  }
  return;
}

Assistant:

SubdivMesh::SubdivMesh (Device* device)
    : Geometry(device,GTY_SUBDIV_MESH,0,1), 
      displFunc(nullptr),
      tessellationRate(2.0f),
      numHalfEdges(0),
      faceStartEdge(device,0),
      halfEdgeFace(device,0),
      holeSet(new HoleSet),
      invalid_face(device,0),
      vertexCreaseMap(new VertexCreaseMap),
      edgeCreaseMap(new EdgeCreaseMap),
      commitCounter(0)
  {
    
    vertices.resize(numTimeSteps);
    vertex_buffer_tags.resize(numTimeSteps);
    topology.resize(1);
    topology[0] = Topology(this);
  }